

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

void duckdb::FindMinimalQualification
               (CatalogEntryRetriever *retriever,string *catalog_name,string *schema_name,
               bool *qualify_database,bool *qualify_schema)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  pointer __s2;
  pointer pCVar4;
  int iVar5;
  bool bVar6;
  pointer pCVar7;
  CatalogSearchEntry *entry;
  bool bVar8;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_c8;
  string *local_b0;
  string local_a8;
  CatalogEntryRetriever *local_88;
  bool *local_80;
  bool *local_78;
  pointer local_70;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_68;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,anon_var_dwarf_63f17de + 9);
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_c8,retriever,&local_a8,
                    schema_name);
  local_b0 = schema_name;
  local_88 = retriever;
  local_80 = qualify_database;
  local_78 = qualify_schema;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pCVar4 = local_c8.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (catalog_name->_M_dataplus)._M_p;
    sVar2 = catalog_name->_M_string_length;
    local_70 = (local_b0->_M_dataplus)._M_p;
    sVar3 = local_b0->_M_string_length;
    pCVar7 = local_c8.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pCVar7->catalog)._M_string_length == sVar2) {
        if (sVar2 != 0) {
          iVar5 = bcmp((pCVar7->catalog)._M_dataplus._M_p,pcVar1,sVar2);
          if (iVar5 != 0) goto LAB_0025889b;
        }
        if ((pCVar7->schema)._M_string_length == sVar3) {
          bVar8 = true;
          if (sVar3 != 0) {
            iVar5 = bcmp((pCVar7->schema)._M_dataplus._M_p,local_70,sVar3);
            if (iVar5 != 0) goto LAB_0025889b;
          }
          bVar6 = false;
          goto LAB_002589b3;
        }
      }
LAB_0025889b:
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar4);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,anon_var_dwarf_63f17de + 9);
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_68,local_88,catalog_name,
                    &local_a8);
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_c8.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_48);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pCVar4 = local_c8.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = true;
  if (local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_c8.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar8 = true;
  }
  else {
    pcVar1 = (catalog_name->_M_dataplus)._M_p;
    sVar2 = catalog_name->_M_string_length;
    __s2 = (local_b0->_M_dataplus)._M_p;
    sVar3 = local_b0->_M_string_length;
    pCVar7 = local_c8.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pCVar7->catalog)._M_string_length == sVar2) {
        if (sVar2 != 0) {
          iVar5 = bcmp((pCVar7->catalog)._M_dataplus._M_p,pcVar1,sVar2);
          if (iVar5 != 0) goto LAB_00258997;
        }
        if ((pCVar7->schema)._M_string_length == sVar3) {
          if (sVar3 != 0) {
            iVar5 = bcmp((pCVar7->schema)._M_dataplus._M_p,__s2,sVar3);
            if (iVar5 != 0) goto LAB_00258997;
          }
          bVar8 = false;
          goto LAB_002589b1;
        }
      }
LAB_00258997:
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar4);
    bVar8 = true;
LAB_002589b1:
    bVar6 = true;
  }
LAB_002589b3:
  *local_80 = bVar6;
  *local_78 = bVar8;
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_c8);
  return;
}

Assistant:

void FindMinimalQualification(CatalogEntryRetriever &retriever, const string &catalog_name, const string &schema_name,
                              bool &qualify_database, bool &qualify_schema) {
	// check if we can we qualify ONLY the schema
	bool found = false;
	auto entries = GetCatalogEntries(retriever, INVALID_CATALOG, schema_name);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = false;
		qualify_schema = true;
		return;
	}
	// check if we can qualify ONLY the catalog
	found = false;
	entries = GetCatalogEntries(retriever, catalog_name, INVALID_SCHEMA);
	for (auto &entry : entries) {
		if (entry.catalog == catalog_name && entry.schema == schema_name) {
			found = true;
			break;
		}
	}
	if (found) {
		qualify_database = true;
		qualify_schema = false;
		return;
	}
	// need to qualify both catalog and schema
	qualify_database = true;
	qualify_schema = true;
}